

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

double add_regularization<dense_parameters>
                 (vw *all,bfgs *b,float regularization,dense_parameters *weights)

{
  weight *pwVar1;
  weight *pwVar2;
  uint32_t uVar3;
  float *pfVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  float fVar10;
  double dVar11;
  
  pfVar4 = weights->_begin;
  if (b->regularizers == (weight *)0x0) {
    if (pfVar4 != pfVar4 + weights->_weight_mask + 1) {
      uVar3 = weights->_stride_shift;
      dVar9 = 0.0;
      do {
        pfVar4[1] = regularization * *pfVar4 + pfVar4[1];
        dVar11 = (double)*pfVar4;
        dVar9 = dVar9 + (double)regularization * 0.5 * dVar11 * dVar11;
        pfVar4 = pfVar4 + (1L << ((byte)uVar3 & 0x3f));
      } while (pfVar4 != weights->_begin + weights->_weight_mask + 1);
      goto LAB_001ba134;
    }
  }
  else if (pfVar4 != pfVar4 + weights->_weight_mask + 1) {
    uVar3 = weights->_stride_shift;
    dVar9 = 0.0;
    lVar7 = 0;
    do {
      uVar8 = (ulong)(lVar7 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
      fVar10 = *(float *)((long)pfVar4 + lVar7) - b->regularizers[uVar8 * 2 + 1];
      *(float *)((long)pfVar4 + lVar7 + 4) =
           b->regularizers[uVar8 * 2] * fVar10 + *(float *)((long)pfVar4 + lVar7 + 4);
      dVar11 = (double)fVar10;
      dVar9 = dVar9 + (double)b->regularizers[uVar8 * 2] * 0.5 * dVar11 * dVar11;
      lVar7 = lVar7 + (1L << ((byte)uVar3 & 0x3f)) * 4;
    } while ((weight *)((long)pfVar4 + lVar7) != weights->_begin + weights->_weight_mask + 1);
    goto LAB_001ba134;
  }
  dVar9 = 0.0;
LAB_001ba134:
  if (all->no_bias == true) {
    pwVar1 = b->regularizers;
    bVar5 = (byte)weights->_stride_shift;
    if (pwVar1 == (weight *)0x0) {
      uVar8 = 0xb1c55cL << (bVar5 & 0x3f) & weights->_weight_mask;
      pwVar1 = weights->_begin;
      pwVar1[uVar8 + 1] = pwVar1[uVar8 + 1] - regularization * pwVar1[uVar8];
      return (double)regularization * -0.5 *
             (double)weights->_begin
                     [0xb1c55cL << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask] *
             (double)weights->_begin
                     [0xb1c55cL << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask] +
             dVar9;
    }
    pwVar2 = weights->_begin;
    uVar8 = 0xb1c55cL << (bVar5 & 0x3f) & weights->_weight_mask;
    uVar6 = (ulong)(uint)((int)(0xb1c55cL >> (bVar5 & 0x3f)) << 3);
    fVar10 = pwVar2[uVar8] - *(float *)((long)pwVar1 + uVar6 + 4);
    pwVar2[uVar8 + 1] = pwVar2[uVar8 + 1] - *(float *)((long)pwVar1 + uVar6) * fVar10;
    dVar11 = (double)fVar10;
    dVar9 = (double)*(float *)((long)b->regularizers + uVar6) * -0.5 * dVar11 * dVar11 + dVar9;
  }
  return dVar9;
}

Assistant:

double add_regularization(vw& all, bfgs& b, float regularization, T& weights)
{
  // compute the derivative difference
  double ret = 0.;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_GT] += regularization * (*w);
      ret += 0.5 * regularization * (*w) * (*w);
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      weight delta_weight = *w - b.regularizers[2 * i + 1];
      (&(*w))[W_GT] += b.regularizers[2 * i] * delta_weight;
      ret += 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }

  // if we're not regularizing the intercept term, then subtract it off from the result above
  // when accessing weights[constant], always use weights.strided_index(constant)
  if (all.no_bias)
  {
    if (b.regularizers == nullptr)
    {
      (&weights.strided_index(constant))[W_GT] -= regularization * (weights.strided_index(constant));
      ret -= 0.5 * regularization * (weights.strided_index(constant)) * (weights.strided_index(constant));
    }
    else
    {
      uint64_t i = constant >> weights.stride_shift();
      weight delta_weight = (weights.strided_index(constant)) - b.regularizers[2 * i + 1];
      (&weights.strided_index(constant))[W_GT] -= b.regularizers[2 * i] * delta_weight;
      ret -= 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }
  }

  return ret;
}